

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFurnitureType::IfcFurnitureType(IfcFurnitureType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcFurnitureType";
  IfcFurnishingElementType::IfcFurnishingElementType
            ((IfcFurnishingElementType *)this,&PTR_construction_vtable_24__00981f18);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x981de8;
  *(undefined8 *)&this->field_0x1c0 = 0x981f00;
  *(undefined8 *)&this->field_0x88 = 0x981e10;
  *(undefined8 *)&this->field_0x98 = 0x981e38;
  *(undefined8 *)&this->field_0xf0 = 0x981e60;
  *(undefined8 *)&this->field_0x148 = 0x981e88;
  *(undefined8 *)&this->field_0x180 = 0x981eb0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x981ed8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}